

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTimer.h
# Opt level: O0

double __thiscall HighsTimer::getWallTime(HighsTimer *this)

{
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  __d;
  rep rVar1;
  double wall_time;
  duration<double,_std::ratio<1L,_1L>_> local_18 [3];
  
  __d.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&stack0xffffffffffffffd8);
  local_18[0].__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)__d.__d.__r);
  rVar1 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_18);
  return rVar1;
}

Assistant:

double getWallTime() const {
    using namespace std::chrono;
    const double wall_time = kNoClockCalls
                                 ? 0
                                 : duration_cast<duration<double> >(
                                       wall_clock::now().time_since_epoch())
                                       .count();
    return wall_time;
  }